

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O3

int iface_get_id(int fd,char *device,char *ebuf)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char local_40 [15];
  undefined1 local_31;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  strncpy(local_40,device,0x10);
  local_31 = 0;
  iVar1 = ioctl(fd,0x8933,local_40);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(ebuf,0x100,"SIOCGIFINDEX: %s",pcVar3);
    local_30._0_4_ = -1;
  }
  else {
  }
  return (int)local_30;
}

Assistant:

static int
iface_get_id(int fd, const char *device, char *ebuf)
{
	struct ifreq	ifr;

	memset(&ifr, 0, sizeof(ifr));
	strlcpy(ifr.ifr_name, device, sizeof(ifr.ifr_name));

	if (ioctl(fd, SIOCGIFINDEX, &ifr) == -1) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			 "SIOCGIFINDEX: %s", pcap_strerror(errno));
		return -1;
	}

	return ifr.ifr_ifindex;
}